

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:779:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:779:17)>
             *this)

{
  SourceLocation location;
  Executor *pEVar1;
  int in_ECX;
  nfds_t __nfds;
  anon_class_1_0_00000001 local_231;
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_> local_230;
  undefined8 in_stack_fffffffffffffdf0;
  WaitScope waitScope;
  PromiseFulfillerPair<void> paf;
  PredicateImpl impl;
  EventLoop loop;
  UnixEventPort port;
  
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  location.function =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  location.fileName = (char *)in_stack_fffffffffffffdf0;
  location._16_8_ = "operator()";
  newPromiseAndFulfiller<void>(location);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=((this->f).fulfiller,&paf.fulfiller);
  pEVar1 = getCurrentThreadExecutor();
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&impl,(this->f).executor);
  *(Executor **)impl.condition = pEVar1;
  Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
            ((Locked<kj::Maybe<const_kj::Executor_&>_> *)&impl);
  local_230.mutex.waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)0x3ddbf3;
  local_230.value.ptr = (Executor *)0x3d356a;
  Promise<void>::wait(&paf.promise,&waitScope);
  WaitScope::poll(&waitScope,(pollfd *)0xffffffffffffffff,__nfds,in_ECX);
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive(&local_230,(this->f).executor);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_00582fb0;
  impl.condition = &local_231;
  impl.value = (Maybe<const_kj::Executor_&> *)local_230.mutex.waitersHead.ptr;
  kj::_::Mutex::wait((Mutex *)local_230.mutex._0_8_,&impl);
  Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
            ((Locked<kj::Maybe<const_kj::Executor_&>_> *)&local_230);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair(&paf);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  UnixEventPort::~UnixEventPort(&port);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }